

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

bool __thiscall asmjit::String::eq(String *this,char *other,size_t size)

{
  char *pcVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  char *__s1;
  bool bVar5;
  
  uVar3 = (ulong)(this->field_0)._type;
  if (uVar3 < 0x1f) {
    __s1 = (char *)((long)&this->field_0 + 1);
  }
  else {
    uVar3 = (this->field_0)._large.size;
    __s1 = (this->field_0)._large.data;
  }
  if (size == 0xffffffffffffffff) {
    uVar4 = 0;
    while (uVar3 != uVar4) {
      pcVar1 = other + uVar4;
      if (__s1[uVar4] != *pcVar1) {
        return false;
      }
      uVar4 = uVar4 + 1;
      if (*pcVar1 == '\0') {
        return false;
      }
    }
    bVar5 = other[uVar3] == '\0';
  }
  else if (uVar3 == size) {
    iVar2 = bcmp(__s1,other,size);
    bVar5 = iVar2 == 0;
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

inline bool isLarge() const noexcept { return _type >= kTypeLarge; }